

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

void Vec_IntTwoMerge2(Vec_Int_t *vArr1,Vec_Int_t *vArr2,Vec_Int_t *vArr)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *vArr_local;
  Vec_Int_t *vArr2_local;
  Vec_Int_t *vArr1_local;
  
  iVar1 = Vec_IntSize(vArr1);
  iVar2 = Vec_IntSize(vArr2);
  Vec_IntGrow(vArr,iVar1 + iVar2);
  Vec_IntTwoMerge2Int(vArr1,vArr2,vArr);
  return;
}

Assistant:

static inline void Vec_IntTwoMerge2( Vec_Int_t * vArr1, Vec_Int_t * vArr2, Vec_Int_t * vArr )
{
    Vec_IntGrow( vArr, Vec_IntSize(vArr1) + Vec_IntSize(vArr2) );
    Vec_IntTwoMerge2Int( vArr1, vArr2, vArr );
}